

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hacdICHull.cpp
# Opt level: O3

double __thiscall
HACD::ICHUll::ComputeDistance
          (ICHUll *this,long name,Vec3<double> *pt,Vec3<double> *normal,bool *insideHull,
          bool updateIncidentPoints)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  CircularListElement<HACD::TMMTriangle> *pCVar3;
  CircularListElement<HACD::TMMVertex> *pCVar4;
  CircularListElement<HACD::TMMVertex> *pCVar5;
  long lVar6;
  CircularListElement<HACD::TMMVertex> *pCVar7;
  long lVar8;
  long lVar9;
  mapped_type *pmVar10;
  size_t sVar11;
  CircularListElement<HACD::TMMTriangle> *pCVar12;
  Real RVar13;
  undefined1 auVar14 [64];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  double dist;
  Vec3<double> ver2;
  Vec3<double> ver1;
  Vec3<double> ver0;
  double local_d0;
  undefined1 local_c8 [16];
  double local_b8;
  long local_b0;
  Vec3<double> local_a8;
  Vec3<double> local_88;
  Vec3<double> local_68;
  Vec3<double> local_48;
  
  RVar13 = 0.0;
  if (this->m_isFlat == false) {
    local_48.m_data[2] = pt->m_data[2];
    local_48.m_data[0] = pt->m_data[0];
    local_48.m_data[1] = pt->m_data[1];
    local_b8 = normal->m_data[2];
    local_c8 = *(undefined1 (*) [16])normal->m_data;
    sVar11 = (this->m_mesh).m_triangles.m_size;
    *insideHull = false;
    if (sVar11 == 0) {
      RVar13 = 0.0;
    }
    else {
      auVar14 = ZEXT1664(ZEXT816(0));
      pCVar12 = (CircularListElement<HACD::TMMTriangle> *)0x0;
      local_b0 = name;
      do {
        pCVar3 = (this->m_mesh).m_triangles.m_head;
        pCVar4 = (pCVar3->m_data).m_vertices[0];
        pCVar5 = (pCVar3->m_data).m_vertices[1];
        lVar9 = (pCVar4->m_data).m_name;
        lVar6 = (pCVar5->m_data).m_name;
        if (lVar9 != lVar6) {
          pCVar7 = (pCVar3->m_data).m_vertices[2];
          lVar8 = (pCVar7->m_data).m_name;
          if ((lVar6 != lVar8) && (lVar8 != lVar9)) {
            if ((lVar8 == name) || ((lVar9 == name || (lVar6 == name)))) {
              local_d0 = 0.0;
              auVar16 = ZEXT816(0) << 0x40;
LAB_0084a080:
              if ((*insideHull != true) || (auVar14._0_8_ < auVar16._0_8_)) {
                *insideHull = true;
                auVar14 = ZEXT1664(auVar16);
                pCVar12 = (this->m_mesh).m_triangles.m_head;
              }
            }
            else {
              local_68.m_data[0] = (pCVar4->m_data).m_pos.m_data[0];
              local_68.m_data[1] = (pCVar4->m_data).m_pos.m_data[1];
              auVar17._8_8_ = 0;
              auVar17._0_8_ = local_c8._0_8_;
              local_68.m_data[2] = (pCVar4->m_data).m_pos.m_data[2];
              local_88.m_data[0] = (pCVar5->m_data).m_pos.m_data[0];
              local_88.m_data[1] = (pCVar5->m_data).m_pos.m_data[1];
              local_88.m_data[2] = (pCVar5->m_data).m_pos.m_data[2];
              local_a8.m_data[0] = (pCVar7->m_data).m_pos.m_data[0];
              local_a8.m_data[1] = (pCVar7->m_data).m_pos.m_data[1];
              local_a8.m_data[2] = (pCVar7->m_data).m_pos.m_data[2];
              auVar1._8_8_ = 0;
              auVar1._0_8_ = normal->m_data[0];
              auVar15._8_8_ = 0;
              auVar15._0_8_ = (double)local_c8._8_8_ * normal->m_data[1];
              auVar16 = vfmadd231sd_fma(auVar15,auVar17,auVar1);
              auVar18._8_8_ = 0;
              auVar18._0_8_ = local_b8;
              auVar2._8_8_ = 0;
              auVar2._0_8_ = normal->m_data[2];
              auVar16 = vfmadd132sd_fma(auVar18,auVar16,auVar2);
              if (0.0 < auVar16._0_8_) {
                lVar9 = IntersectRayTriangle
                                  (&local_48,(Vec3<double> *)local_c8,&local_68,&local_88,&local_a8,
                                   &local_d0);
                if (lVar9 == 1) {
                  auVar16._8_8_ = 0;
                  auVar16._0_8_ = local_d0;
                  auVar14 = ZEXT864(auVar14._0_8_);
                  goto LAB_0084a080;
                }
                auVar14 = ZEXT864(auVar14._0_8_);
              }
            }
          }
        }
        RVar13 = auVar14._0_8_;
        if ((this->m_mesh).m_triangles.m_size != 0) {
          (this->m_mesh).m_triangles.m_head = ((this->m_mesh).m_triangles.m_head)->m_next;
        }
        sVar11 = sVar11 - 1;
      } while (sVar11 != 0);
      if ((updateIncidentPoints && pCVar12 != (CircularListElement<HACD::TMMTriangle> *)0x0) &&
         (this->m_distPoints !=
          (map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
           *)0x0)) {
        pmVar10 = std::
                  map<long,_HACD::DPoint,_std::less<long>,_std::allocator<std::pair<const_long,_HACD::DPoint>_>_>
                  ::operator[](this->m_distPoints,&local_b0);
        pmVar10->m_dist = RVar13;
        SArray<long,_16UL>::Insert(&(pCVar12->m_data).m_incidentPoints,&local_b0);
      }
    }
  }
  return RVar13;
}

Assistant:

double ICHUll::ComputeDistance(long name, const Vec3<Real> & pt, const Vec3<Real> & normal, bool & insideHull, bool updateIncidentPoints)
	{
		if (m_isFlat)
		{
			return  0.0;
		}
		else
		{
			Vec3<double> p0( static_cast<double>(pt.X()), 
							 static_cast<double>(pt.Y()), 
							 static_cast<double>(pt.Z()));

			Vec3<double> ptNormal(static_cast<double>(normal.X()), 
								  static_cast<double>(normal.Y()), 
								  static_cast<double>(normal.Z()));
			Vec3<double> impact;
			long nhit;
			double dist;
			double distance = 0.0; 
			size_t nT = m_mesh.GetNTriangles();
			insideHull = false;
			CircularListElement<TMMTriangle> * face = 0;
			Vec3<double> ver0, ver1, ver2;
			for(size_t f = 0; f < nT; f++)
			{
				TMMTriangle & currentTriangle = m_mesh.m_triangles.GetHead()->GetData();
                nhit = 0;
				if (currentTriangle.m_vertices[0]->GetData().m_name != currentTriangle.m_vertices[1]->GetData().m_name &&
					currentTriangle.m_vertices[1]->GetData().m_name != currentTriangle.m_vertices[2]->GetData().m_name &&
					currentTriangle.m_vertices[2]->GetData().m_name != currentTriangle.m_vertices[0]->GetData().m_name)
				{
					if (currentTriangle.m_vertices[0]->GetData().m_name == name ||
						currentTriangle.m_vertices[1]->GetData().m_name == name ||
						currentTriangle.m_vertices[2]->GetData().m_name == name)
					{
						nhit = 1;
						dist = 0.0;
					}
					else
					{
						ver0.X() = currentTriangle.m_vertices[0]->GetData().m_pos.X();
						ver0.Y() = currentTriangle.m_vertices[0]->GetData().m_pos.Y();
						ver0.Z() = currentTriangle.m_vertices[0]->GetData().m_pos.Z();
						ver1.X() = currentTriangle.m_vertices[1]->GetData().m_pos.X();
						ver1.Y() = currentTriangle.m_vertices[1]->GetData().m_pos.Y();
						ver1.Z() = currentTriangle.m_vertices[1]->GetData().m_pos.Z();
						ver2.X() = currentTriangle.m_vertices[2]->GetData().m_pos.X();
						ver2.Y() = currentTriangle.m_vertices[2]->GetData().m_pos.Y();
						ver2.Z() = currentTriangle.m_vertices[2]->GetData().m_pos.Z();
						Vec3<Real> faceNormal = (ver1-ver0) ^ (ver2-ver0);
						faceNormal.Normalize();
						if (ptNormal*normal > 0.0)
						{
							nhit = IntersectRayTriangle(p0, ptNormal, ver0, ver1, ver2, dist);
						}                        
					}
#ifdef HACD_DEBUG
					std::cout << "T " << currentTriangle.m_vertices[0]->GetData().m_name << " "
									  << currentTriangle.m_vertices[1]->GetData().m_name << " "
									  << currentTriangle.m_vertices[2]->GetData().m_name << " "
									  << nhit << " " << dist << std::endl;
#endif
					if (nhit == 1 && (!insideHull || dist > distance) )
					{
						distance = dist;
						insideHull = true;
						face = m_mesh.m_triangles.GetHead();
					}
				}
				m_mesh.m_triangles.Next();
			}
			if (updateIncidentPoints && face && m_distPoints)
			{
				(*m_distPoints)[name].m_dist = static_cast<Real>(distance);
				face->GetData().m_incidentPoints.Insert(name);
			}
			return distance;
		}
	}